

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void do_add_const(void *ptr,int nelem,int type,void *alpha)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  double *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  Integer in_stack_00000128;
  char *in_stack_00000130;
  float local_60;
  float fStack_5c;
  int local_1c;
  
  switch(in_EDX) {
  case 0x3e9:
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      *(int *)(in_RDI + (long)local_1c * 4) =
           (int)*(float *)in_RCX + *(int *)(in_RDI + (long)local_1c * 4);
    }
    break;
  case 0x3ea:
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      *(long *)(in_RDI + (long)local_1c * 8) =
           (long)*in_RCX + *(long *)(in_RDI + (long)local_1c * 8);
    }
    break;
  case 0x3eb:
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      *(float *)(in_RDI + (long)local_1c * 4) =
           *(float *)in_RCX + *(float *)(in_RDI + (long)local_1c * 4);
    }
    break;
  case 0x3ec:
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      *(double *)(in_RDI + (long)local_1c * 8) = *in_RCX + *(double *)(in_RDI + (long)local_1c * 8);
    }
    break;
  default:
    pnga_error(in_stack_00000130,in_stack_00000128);
    break;
  case 0x3ee:
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      dVar1 = *in_RCX;
      local_60 = SUB84(dVar1,0);
      *(float *)(in_RDI + (long)local_1c * 8) = local_60 + *(float *)(in_RDI + (long)local_1c * 8);
      fStack_5c = (float)((ulong)dVar1 >> 0x20);
      *(float *)(in_RDI + 4 + (long)local_1c * 8) =
           fStack_5c + *(float *)(in_RDI + 4 + (long)local_1c * 8);
    }
    break;
  case 0x3ef:
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      dVar1 = in_RCX[1];
      pdVar2 = (double *)(in_RDI + (long)local_1c * 0x10);
      *pdVar2 = *in_RCX + *pdVar2;
      lVar3 = in_RDI + (long)local_1c * 0x10;
      *(double *)(lVar3 + 8) = dVar1 + *(double *)(lVar3 + 8);
    }
  }
  return;
}

Assistant:

static void do_add_const(void *ptr, int nelem, int type, void *alpha)
{
    int i;
    switch (type){
         int *ia;
         double *da;
         float *fa;
         DoubleComplex *ca,val;
         SingleComplex *cfa,cval;
	 long *la;

         case C_INT:
              ia = (int *)ptr;
              for(i=0;i<nelem;i++)
                  ia[i] += *(int *)alpha;
              break;
         case C_DCPL:
              ca = (DoubleComplex *) ptr;
              for(i=0;i<nelem;i++){
                  val = *(DoubleComplex*)alpha;
                  ca[i].real += val.real;
                  ca[i].imag += val.imag;
              }
              break;
         case C_SCPL:
              cfa = (SingleComplex *) ptr;
              for(i=0;i<nelem;i++){
                  cval = *(SingleComplex*)alpha;
                  cfa[i].real += cval.real;
                  cfa[i].imag += cval.imag;
              }
              break;
         case C_DBL:
              da = (double *) ptr;
              for(i=0;i<nelem;i++)
                  da[i] += *(double*)alpha;
              break;
         case C_FLOAT:
              fa = (float *)ptr;
              for(i=0;i<nelem;i++)
                  fa[i] += *(float*)alpha;
              break;
	 case C_LONG:
              la = (long *)ptr;
              for(i=0;i<nelem;i++)
                  la[i] += *(long *)alpha;
              break;

         default: pnga_error("wrong data type",type);
    }
}